

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

void vkt::api::anon_unknown_0::android::checkExtensions
               (ResultCollector *results,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *allowedExtensions,
               vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
               *reportedExtensions)

{
  bool bVar1;
  pointer __s;
  bool local_11a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  byte local_db;
  byte local_da;
  allocator<char> local_d9;
  string local_d8;
  byte local_b3;
  byte local_b2;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  undefined1 local_65;
  bool mustBeKnown;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string extensionName;
  __normal_iterator<const_vk::VkExtensionProperties_*,_std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>_>
  local_28;
  const_iterator extension;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
  *reportedExtensions_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *allowedExtensions_local;
  ResultCollector *results_local;
  
  extension._M_current = (VkExtensionProperties *)reportedExtensions;
  local_28._M_current =
       (VkExtensionProperties *)
       std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::begin
                 (reportedExtensions);
  while( true ) {
    extensionName.field_2._8_8_ =
         std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::end
                   ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *
                    )extension._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_vk::VkExtensionProperties_*,_std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>_>
                        *)((long)&extensionName.field_2 + 8));
    if (!bVar1) break;
    __s = __gnu_cxx::
          __normal_iterator<const_vk::VkExtensionProperties_*,_std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>_>
          ::operator->(&local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,__s->extensionName,&local_51);
    std::allocator<char>::~allocator(&local_51);
    std::allocator<char>::allocator();
    local_b2 = 0;
    local_b3 = 0;
    local_da = 0;
    local_db = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"VK_KHX_",&local_89);
    bVar1 = de::beginsWith((string *)local_50,&local_88);
    local_11a = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_b2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"VK_GOOGLE_",&local_b1)
      ;
      local_b3 = 1;
      bVar1 = de::beginsWith((string *)local_50,&local_b0);
      local_11a = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_da = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"VK_ANDROID_",&local_d9);
        local_db = 1;
        local_11a = de::beginsWith((string *)local_50,&local_d8);
      }
    }
    if ((local_db & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_d8);
    }
    if ((local_da & 1) != 0) {
      std::allocator<char>::~allocator(&local_d9);
    }
    if ((local_b3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if ((local_b2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_b1);
    }
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    local_65 = local_11a;
    if ((local_11a != false) &&
       (bVar1 = de::
                contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                          (allowedExtensions,(key_type *)local_50), !bVar1)) {
      std::operator+(&local_100,"Unknown extension: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      tcu::ResultCollector::fail(results,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
    }
    std::__cxx11::string::~string((string *)local_50);
    __gnu_cxx::
    __normal_iterator<const_vk::VkExtensionProperties_*,_std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void checkExtensions (tcu::ResultCollector& results, const set<string>& allowedExtensions, const vector<VkExtensionProperties>& reportedExtensions)
{
	for (vector<VkExtensionProperties>::const_iterator extension = reportedExtensions.begin(); extension != reportedExtensions.end(); ++extension)
	{
		const string	extensionName	(extension->extensionName);
		const bool		mustBeKnown		= de::beginsWith(extensionName, "VK_KHX_")		||
										  de::beginsWith(extensionName, "VK_GOOGLE_")	||
										  de::beginsWith(extensionName, "VK_ANDROID_");

		if (mustBeKnown && !de::contains(allowedExtensions, extensionName))
			results.fail("Unknown extension: " + extensionName);
	}
}